

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O1

int32_t icu_63::number::impl::NumberFormatterImpl::writeNumber
                  (MicroProps *micros,DecimalQuantity *quantity,NumberStringBuilder *string,
                  int32_t index,UErrorCode *status)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  long lVar4;
  UnicodeString local_70;
  
  iVar1 = (*(quantity->super_IFixedDecimal)._vptr_IFixedDecimal[4])(quantity);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(quantity->super_IFixedDecimal)._vptr_IFixedDecimal[3])(quantity);
    if ((char)iVar1 == '\0') {
      iVar2 = writeIntegerDigits(micros,quantity,string,index,status);
      iVar3 = DecimalQuantity::getLowerDisplayMagnitude(quantity);
      if ((iVar3 < 0) || (micros->decimal == UNUM_DECIMAL_SEPARATOR_ALWAYS)) {
        lVar4 = 8;
        if (micros->useCurrency != false) {
          lVar4 = 0x288;
        }
        UnicodeString::UnicodeString
                  (&local_70,
                   (UnicodeString *)((long)&(micros->symbols->super_UObject)._vptr_UObject + lVar4))
        ;
        iVar3 = NumberStringBuilder::insert
                          (string,iVar2 + index,&local_70,UNUM_DECIMAL_SEPARATOR_FIELD,status);
        iVar2 = iVar3 + iVar2;
        UnicodeString::~UnicodeString(&local_70);
      }
      iVar3 = writeFractionDigits(micros,quantity,string,index + iVar2,status);
      return iVar3 + iVar2;
    }
    UnicodeString::UnicodeString(&local_70,(UnicodeString *)&micros->symbols->field_0x3c8);
    iVar2 = NumberStringBuilder::insert(string,index,&local_70,UNUM_INTEGER_FIELD,status);
  }
  else {
    UnicodeString::UnicodeString(&local_70,(UnicodeString *)&micros->symbols->field_0x388);
    iVar2 = NumberStringBuilder::insert(string,index,&local_70,UNUM_INTEGER_FIELD,status);
  }
  UnicodeString::~UnicodeString(&local_70);
  return iVar2;
}

Assistant:

int32_t NumberFormatterImpl::writeNumber(const MicroProps& micros, DecimalQuantity& quantity,
                                         NumberStringBuilder& string, int32_t index,
                                         UErrorCode& status) {
    int32_t length = 0;
    if (quantity.isInfinite()) {
        length += string.insert(
                length + index,
                micros.symbols->getSymbol(DecimalFormatSymbols::ENumberFormatSymbol::kInfinitySymbol),
                UNUM_INTEGER_FIELD,
                status);

    } else if (quantity.isNaN()) {
        length += string.insert(
                length + index,
                micros.symbols->getSymbol(DecimalFormatSymbols::ENumberFormatSymbol::kNaNSymbol),
                UNUM_INTEGER_FIELD,
                status);

    } else {
        // Add the integer digits
        length += writeIntegerDigits(micros, quantity, string, length + index, status);

        // Add the decimal point
        if (quantity.getLowerDisplayMagnitude() < 0 || micros.decimal == UNUM_DECIMAL_SEPARATOR_ALWAYS) {
            length += string.insert(
                    length + index,
                    micros.useCurrency ? micros.symbols->getSymbol(
                            DecimalFormatSymbols::ENumberFormatSymbol::kMonetarySeparatorSymbol) : micros
                            .symbols
                            ->getSymbol(
                                    DecimalFormatSymbols::ENumberFormatSymbol::kDecimalSeparatorSymbol),
                    UNUM_DECIMAL_SEPARATOR_FIELD,
                    status);
        }

        // Add the fraction digits
        length += writeFractionDigits(micros, quantity, string, length + index, status);
    }

    return length;
}